

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O1

void __thiscall
cmCPackIFWGenerator::WriteGeneratedByToStrim(cmCPackIFWGenerator *this,cmGeneratedFileStream *xout)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  char *pcVar4;
  cmTimestamp local_59;
  string local_58;
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)xout,"<!-- Generated by CPack ",0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)xout,"3.5.1",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)xout," IFW generator ",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)xout,"for QtIFW ",10);
  bVar1 = cmSystemTools::VersionCompare(OP_LESS,(this->FrameworkVersion)._M_dataplus._M_p,"2.0");
  if (bVar1) {
    pcVar4 = "less 2.0";
    sVar3 = 8;
  }
  else {
    pcVar4 = (this->FrameworkVersion)._M_dataplus._M_p;
    sVar3 = (this->FrameworkVersion)._M_string_length;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)xout,pcVar4,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)xout," tools at ",10);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  cmTimestamp::CurrentTime(&local_58,&local_59,&local_38,true);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)xout,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," -->",4);
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCPackIFWGenerator::WriteGeneratedByToStrim(cmGeneratedFileStream &xout)
{
  xout << "<!-- Generated by CPack " << CMake_VERSION << " IFW generator "
       << "for QtIFW ";
  if(IsVersionLess("2.0"))
    {
    xout << "less 2.0";
    }
  else
    {
    xout << FrameworkVersion;
    }
  xout << " tools at " << cmTimestamp().CurrentTime("", true) << " -->"
       << std::endl;
}